

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# module-splitting.cpp
# Opt level: O2

Slot * __thiscall
wasm::ModuleSplitting::anon_unknown_0::TableSlotManager::getSlot
          (Slot *__return_storage_ptr__,TableSlotManager *this,Name func,HeapType type)

{
  _Rb_tree_header *p_Var1;
  _Base_ptr p_Var2;
  Module *pMVar3;
  _Head_base<0UL,_wasm::DylinkSection_*,_false> _Var4;
  _Base_ptr p_Var5;
  _Base_ptr p_Var6;
  Name func_00;
  Name func_01;
  TableSlotManager *this_00;
  bool bVar7;
  _Base_ptr *pp_Var8;
  Table *pTVar9;
  pointer puVar10;
  Type type_00;
  ElementSegment *pEVar11;
  char *pcVar12;
  pointer puVar13;
  long lVar14;
  long lVar15;
  uint uVar16;
  _Base_ptr p_Var17;
  Name NVar18;
  Name root;
  Name root_00;
  Name name;
  Name name_00;
  Type local_b0;
  __uniq_ptr_impl<wasm::Table,_std::default_delete<wasm::Table>_> _Stack_a8;
  Builder builder;
  Name local_98;
  undefined4 local_88;
  TableSlotManager *local_78;
  HeapType local_70;
  char *local_68;
  char *local_60;
  Expression *local_58;
  Address local_50;
  undefined1 local_48 [8];
  Name func_local;
  
  pcVar12 = func.super_IString.str._M_str;
  local_48 = func.super_IString.str._M_len;
  p_Var1 = &(this->funcIndices)._M_t._M_impl.super__Rb_tree_header;
  pp_Var8 = &(this->funcIndices)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
  p_Var17 = &p_Var1->_M_header;
  local_78 = this;
  local_70.id = type.id;
  func_local.super_IString.str._M_len = (size_t)pcVar12;
  while (p_Var2 = *pp_Var8, p_Var2 != (_Base_ptr)0x0) {
    bVar7 = IString::operator<((IString *)(p_Var2 + 1),(IString *)local_48);
    if (!bVar7) {
      p_Var17 = p_Var2;
    }
    pp_Var8 = &p_Var2->_M_left + bVar7;
  }
  if (((_Rb_tree_header *)p_Var17 != p_Var1) &&
     (bVar7 = IString::operator<((IString *)local_48,(IString *)(p_Var17 + 1)), !bVar7)) {
    *(_Base_ptr *)&__return_storage_ptr__->index = p_Var17[2]._M_left;
    p_Var2 = p_Var17[1]._M_left;
    p_Var5 = p_Var17[1]._M_right;
    p_Var6 = p_Var17[2]._M_parent;
    (__return_storage_ptr__->global).super_IString.str._M_len = *(size_t *)(p_Var17 + 2);
    (__return_storage_ptr__->global).super_IString.str._M_str = (char *)p_Var6;
    (__return_storage_ptr__->tableName).super_IString.str._M_len = (size_t)p_Var2;
    (__return_storage_ptr__->tableName).super_IString.str._M_str = (char *)p_Var5;
    return __return_storage_ptr__;
  }
  this_00 = local_78;
  pEVar11 = local_78->activeSegment;
  if (pEVar11 != (ElementSegment *)0x0) goto LAB_00af6ea8;
  pTVar9 = local_78->activeTable;
  if (pTVar9 == (Table *)0x0) {
    pMVar3 = local_78->module;
    NVar18 = Name::fromInt(0);
    root.super_IString.str._M_len = NVar18.super_IString.str._M_str;
    root.super_IString.str._M_str = pcVar12;
    NVar18 = Names::getValidTableName((Names *)pMVar3,NVar18.super_IString.str._M_len,root);
    func_local.super_IString.str._M_str = NVar18.super_IString.str._M_len;
    wasm::Type::Type((Type *)&local_50,(HeapType)0x1,Nullable);
    name.super_IString.str._M_str = func_local.super_IString.str._M_str;
    name.super_IString.str._M_len = (size_t)&_Stack_a8;
    Builder::makeTable(name,(Type)NVar18.super_IString.str._M_str,local_50,(Address)0x0);
    pTVar9 = Module::addTable(pMVar3,(unique_ptr<wasm::Table,_std::default_delete<wasm::Table>_> *)
                                     &_Stack_a8);
    std::unique_ptr<wasm::Table,_std::default_delete<wasm::Table>_>::~unique_ptr
              ((unique_ptr<wasm::Table,_std::default_delete<wasm::Table>_> *)&_Stack_a8);
    this_00->activeTable = pTVar9;
    _Stack_a8._M_t.super__Tuple_impl<0UL,_wasm::Table_*,_std::default_delete<wasm::Table>_>.
    super__Head_base<0UL,_wasm::Table_*,_false>._M_head_impl =
         (tuple<wasm::Table_*,_std::default_delete<wasm::Table>_>)
         (pTVar9->super_Importable).super_Named.name.super_IString.str._M_len;
    builder.wasm = (Module *)(pTVar9->super_Importable).super_Named.name.super_IString.str._M_str;
    Name::Name(&local_98,"");
    local_88 = 0;
    (this_00->activeBase).tableName.super_IString.str._M_len =
         (size_t)_Stack_a8._M_t.
                 super__Tuple_impl<0UL,_wasm::Table_*,_std::default_delete<wasm::Table>_>.
                 super__Head_base<0UL,_wasm::Table_*,_false>._M_head_impl;
    (this_00->activeBase).tableName.super_IString.str._M_str = (char *)builder.wasm;
    (this_00->activeBase).global.super_IString.str._M_len = local_98.super_IString.str._M_len;
    (this_00->activeBase).global.super_IString.str._M_str = local_98.super_IString.str._M_str;
    (this_00->activeBase).index = 0;
    pTVar9 = this_00->activeTable;
  }
  pMVar3 = this_00->module;
  puVar10 = (pMVar3->elementSegments).
            super__Vector_base<std::unique_ptr<wasm::ElementSegment,_std::default_delete<wasm::ElementSegment>_>,_std::allocator<std::unique_ptr<wasm::ElementSegment,_std::default_delete<wasm::ElementSegment>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
  puVar13 = (pMVar3->elementSegments).
            super__Vector_base<std::unique_ptr<wasm::ElementSegment,_std::default_delete<wasm::ElementSegment>_>,_std::allocator<std::unique_ptr<wasm::ElementSegment,_std::default_delete<wasm::ElementSegment>_>_>_>
            ._M_impl.super__Vector_impl_data._M_finish;
  lVar14 = (long)puVar13 - (long)puVar10;
  for (lVar15 = lVar14 >> 5; 0 < lVar15; lVar15 = lVar15 + -1) {
    pcVar12 = (pTVar9->super_Importable).super_Named.name.super_IString.str._M_str;
    if (*(char **)((long)&(((puVar10->_M_t).
                            super___uniq_ptr_impl<wasm::ElementSegment,_std::default_delete<wasm::ElementSegment>_>
                            ._M_t.
                            super__Tuple_impl<0UL,_wasm::ElementSegment_*,_std::default_delete<wasm::ElementSegment>_>
                            .super__Head_base<0UL,_wasm::ElementSegment_*,_false>._M_head_impl)->
                          table).super_IString + 8) == pcVar12) goto LAB_00af6e02;
    if (*(char **)((long)&((puVar10[1]._M_t.
                            super___uniq_ptr_impl<wasm::ElementSegment,_std::default_delete<wasm::ElementSegment>_>
                            ._M_t.
                            super__Tuple_impl<0UL,_wasm::ElementSegment_*,_std::default_delete<wasm::ElementSegment>_>
                            .super__Head_base<0UL,_wasm::ElementSegment_*,_false>._M_head_impl)->
                          table).super_IString + 8) == pcVar12) {
      puVar10 = puVar10 + 1;
      goto LAB_00af6e02;
    }
    if (*(char **)((long)&((puVar10[2]._M_t.
                            super___uniq_ptr_impl<wasm::ElementSegment,_std::default_delete<wasm::ElementSegment>_>
                            ._M_t.
                            super__Tuple_impl<0UL,_wasm::ElementSegment_*,_std::default_delete<wasm::ElementSegment>_>
                            .super__Head_base<0UL,_wasm::ElementSegment_*,_false>._M_head_impl)->
                          table).super_IString + 8) == pcVar12) {
      puVar10 = puVar10 + 2;
      goto LAB_00af6e02;
    }
    if (*(char **)((long)&((puVar10[3]._M_t.
                            super___uniq_ptr_impl<wasm::ElementSegment,_std::default_delete<wasm::ElementSegment>_>
                            ._M_t.
                            super__Tuple_impl<0UL,_wasm::ElementSegment_*,_std::default_delete<wasm::ElementSegment>_>
                            .super__Head_base<0UL,_wasm::ElementSegment_*,_false>._M_head_impl)->
                          table).super_IString + 8) == pcVar12) {
      puVar10 = puVar10 + 3;
      goto LAB_00af6e02;
    }
    puVar10 = puVar10 + 4;
    lVar14 = lVar14 + -0x20;
  }
  lVar14 = lVar14 >> 3;
  if (lVar14 == 3) {
    pcVar12 = (pTVar9->super_Importable).super_Named.name.super_IString.str._M_str;
    if (*(char **)((long)&(((puVar10->_M_t).
                            super___uniq_ptr_impl<wasm::ElementSegment,_std::default_delete<wasm::ElementSegment>_>
                            ._M_t.
                            super__Tuple_impl<0UL,_wasm::ElementSegment_*,_std::default_delete<wasm::ElementSegment>_>
                            .super__Head_base<0UL,_wasm::ElementSegment_*,_false>._M_head_impl)->
                          table).super_IString + 8) != pcVar12) {
      puVar10 = puVar10 + 1;
      goto LAB_00af6dea;
    }
LAB_00af6e02:
    if (puVar10 != puVar13) {
      __assert_fail("std::all_of(module.elementSegments.begin(), module.elementSegments.end(), [&](std::unique_ptr<ElementSegment>& segment) { return segment->table != activeTable->name; })"
                    ,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/ir/module-splitting.cpp"
                    ,0xe7,
                    "TableSlotManager::Slot wasm::ModuleSplitting::(anonymous namespace)::TableSlotManager::getSlot(Name, HeapType)"
                   );
    }
  }
  else {
    if (lVar14 == 2) {
      pcVar12 = (pTVar9->super_Importable).super_Named.name.super_IString.str._M_str;
LAB_00af6dea:
      if (*(char **)((long)&(((puVar10->_M_t).
                              super___uniq_ptr_impl<wasm::ElementSegment,_std::default_delete<wasm::ElementSegment>_>
                              ._M_t.
                              super__Tuple_impl<0UL,_wasm::ElementSegment_*,_std::default_delete<wasm::ElementSegment>_>
                              .super__Head_base<0UL,_wasm::ElementSegment_*,_false>._M_head_impl)->
                            table).super_IString + 8) != pcVar12) {
        puVar10 = puVar10 + 1;
        goto LAB_00af6df7;
      }
      goto LAB_00af6e02;
    }
    if (lVar14 == 1) {
      pcVar12 = (pTVar9->super_Importable).super_Named.name.super_IString.str._M_str;
LAB_00af6df7:
      if (*(char **)((long)&(((puVar10->_M_t).
                              super___uniq_ptr_impl<wasm::ElementSegment,_std::default_delete<wasm::ElementSegment>_>
                              ._M_t.
                              super__Tuple_impl<0UL,_wasm::ElementSegment_*,_std::default_delete<wasm::ElementSegment>_>
                              .super__Head_base<0UL,_wasm::ElementSegment_*,_false>._M_head_impl)->
                            table).super_IString + 8) != pcVar12) {
        puVar10 = puVar13;
      }
      goto LAB_00af6e02;
    }
  }
  NVar18 = Name::fromInt(0);
  root_00.super_IString.str._M_len = NVar18.super_IString.str._M_str;
  root_00.super_IString.str._M_str = (char *)puVar13;
  NVar18 = Names::getValidElementSegmentName
                     ((Names *)pMVar3,NVar18.super_IString.str._M_len,root_00);
  local_68 = NVar18.super_IString.str._M_str;
  func_local.super_IString.str._M_str = NVar18.super_IString.str._M_len;
  local_60 = (char *)(this_00->activeTable->super_Importable).super_Named.name.super_IString.str.
                     _M_len;
  local_58 = (Expression *)
             (this_00->activeTable->super_Importable).super_Named.name.super_IString.str._M_str;
  local_50.addr = (address64_t)this_00->module;
  type_00.id = (uintptr_t)Builder::makeConst<int>((Builder *)&local_50,0);
  wasm::Type::Type(&local_b0,(HeapType)0x1,Nullable);
  NVar18.super_IString.str._M_str = local_60;
  NVar18.super_IString.str._M_len = (size_t)local_68;
  name_00.super_IString.str._M_str = func_local.super_IString.str._M_str;
  name_00.super_IString.str._M_len = (size_t)&_Stack_a8;
  Builder::makeElementSegment(name_00,NVar18,local_58,type_00);
  pEVar11 = Module::addElementSegment
                      (pMVar3,(unique_ptr<wasm::ElementSegment,_std::default_delete<wasm::ElementSegment>_>
                               *)&_Stack_a8);
  std::unique_ptr<wasm::ElementSegment,_std::default_delete<wasm::ElementSegment>_>::~unique_ptr
            ((unique_ptr<wasm::ElementSegment,_std::default_delete<wasm::ElementSegment>_> *)
             &_Stack_a8);
  this_00->activeSegment = pEVar11;
LAB_00af6ea8:
  pcVar12 = (this_00->activeBase).tableName.super_IString.str._M_str;
  (__return_storage_ptr__->tableName).super_IString.str._M_len =
       (this_00->activeBase).tableName.super_IString.str._M_len;
  (__return_storage_ptr__->tableName).super_IString.str._M_str = pcVar12;
  pcVar12 = (this_00->activeBase).global.super_IString.str._M_str;
  (__return_storage_ptr__->global).super_IString.str._M_len =
       (this_00->activeBase).global.super_IString.str._M_len;
  (__return_storage_ptr__->global).super_IString.str._M_str = pcVar12;
  uVar16 = (int)((ulong)((long)(pEVar11->data).
                               super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>
                               ._M_impl.super__Vector_impl_data._M_finish -
                        (long)(pEVar11->data).
                              super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>
                              ._M_impl.super__Vector_impl_data._M_start) >> 3) +
           (this_00->activeBase).index;
  __return_storage_ptr__->index = uVar16;
  _Stack_a8._M_t.super__Tuple_impl<0UL,_wasm::Table_*,_std::default_delete<wasm::Table>_>.
  super__Head_base<0UL,_wasm::Table_*,_false>._M_head_impl =
       (tuple<wasm::Table_*,_std::default_delete<wasm::Table>_>)this_00->module;
  func_00.super_IString.str._M_str = (char *)func_local.super_IString.str._M_len;
  func_00.super_IString.str._M_len = (size_t)local_48;
  local_50.addr = (address64_t)Builder::makeRefFunc((Builder *)&_Stack_a8,func_00,local_70);
  std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>::emplace_back<wasm::Expression*>
            ((vector<wasm::Expression*,std::allocator<wasm::Expression*>> *)&pEVar11->data,
             (Expression **)&local_50);
  func_01.super_IString.str._M_str = (char *)func_local.super_IString.str._M_len;
  func_01.super_IString.str._M_len = (size_t)local_48;
  addSlot(this_00,func_01,*__return_storage_ptr__);
  pTVar9 = this_00->activeTable;
  if ((pTVar9->initial).addr <= (ulong)uVar16) {
    (pTVar9->initial).addr = (ulong)(uVar16 + 1);
    _Var4._M_head_impl =
         (this_00->module->dylinkSection)._M_t.
         super___uniq_ptr_impl<wasm::DylinkSection,_std::default_delete<wasm::DylinkSection>_>._M_t.
         super__Tuple_impl<0UL,_wasm::DylinkSection_*,_std::default_delete<wasm::DylinkSection>_>.
         super__Head_base<0UL,_wasm::DylinkSection_*,_false>._M_head_impl;
    if (_Var4._M_head_impl != (DylinkSection *)0x0) {
      (_Var4._M_head_impl)->tableSize = uVar16 + 1;
    }
  }
  if ((pTVar9->max).addr <= (ulong)uVar16) {
    (pTVar9->max).addr = (ulong)(uVar16 + 1);
  }
  return __return_storage_ptr__;
}

Assistant:

TableSlotManager::Slot TableSlotManager::getSlot(Name func, HeapType type) {
  auto slotIt = funcIndices.find(func);
  if (slotIt != funcIndices.end()) {
    return slotIt->second;
  }

  // If there are no segments yet, allocate one.
  if (activeSegment == nullptr) {
    if (activeTable == nullptr) {
      activeTable = makeTable();
      activeBase = {activeTable->name, "", 0};
    }

    // None of the existing segments should refer to the active table
    assert(std::all_of(module.elementSegments.begin(),
                       module.elementSegments.end(),
                       [&](std::unique_ptr<ElementSegment>& segment) {
                         return segment->table != activeTable->name;
                       }));

    activeSegment = makeElementSegment();
  }

  Slot newSlot = {activeBase.tableName,
                  activeBase.global,
                  activeBase.index + Index(activeSegment->data.size())};

  Builder builder(module);
  activeSegment->data.push_back(builder.makeRefFunc(func, type));

  addSlot(func, newSlot);
  if (activeTable->initial <= newSlot.index) {
    activeTable->initial = newSlot.index + 1;
    // TODO: handle the active table not being the dylink table (#3823)
    if (module.dylinkSection) {
      module.dylinkSection->tableSize = activeTable->initial;
    }
  }
  if (activeTable->max <= newSlot.index) {
    activeTable->max = newSlot.index + 1;
  }
  return newSlot;
}